

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::EnsurePreReservedRegion
          (PreReservedVirtualAllocWrapper *this)

{
  AutoCriticalSection local_28;
  AutoCriticalSection autocs;
  LPVOID startAddress;
  PreReservedVirtualAllocWrapper *this_local;
  
  autocs.cs = (CriticalSection *)this->preReservedStartAddress;
  this_local = (PreReservedVirtualAllocWrapper *)autocs.cs;
  if ((PreReservedVirtualAllocWrapper *)autocs.cs == (PreReservedVirtualAllocWrapper *)0x0) {
    AutoCriticalSection::AutoCriticalSection(&local_28,&this->cs);
    this_local = (PreReservedVirtualAllocWrapper *)EnsurePreReservedRegionInternal(this);
    AutoCriticalSection::~AutoCriticalSection(&local_28);
  }
  return this_local;
}

Assistant:

LPVOID PreReservedVirtualAllocWrapper::EnsurePreReservedRegion()
{
    LPVOID startAddress = preReservedStartAddress;
    if (startAddress != nullptr)
    {
        return startAddress;
    }

    {
        AutoCriticalSection autocs(&this->cs);
        return EnsurePreReservedRegionInternal();
    }
}